

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_install_compiler_options(spvc_compiler compiler,spvc_compiler_options options)

{
  spvc_backend sVar1;
  CompilerHLSL *this;
  CompilerGLSL *pCVar2;
  CompilerMSL *this_00;
  spvc_compiler_options options_local;
  spvc_compiler compiler_local;
  
  sVar1 = compiler->backend;
  if (sVar1 == SPVC_BACKEND_GLSL) {
    pCVar2 = (CompilerGLSL *)
             std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
             operator*(&compiler->compiler);
    spirv_cross::CompilerGLSL::set_common_options(pCVar2,&options->glsl);
  }
  else if (sVar1 == SPVC_BACKEND_HLSL) {
    pCVar2 = (CompilerGLSL *)
             std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
             operator*(&compiler->compiler);
    spirv_cross::CompilerGLSL::set_common_options(pCVar2,&options->glsl);
    this = (CompilerHLSL *)
           std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
           operator*(&compiler->compiler);
    spirv_cross::CompilerHLSL::set_hlsl_options(this,&options->hlsl);
  }
  else if (sVar1 == SPVC_BACKEND_MSL) {
    pCVar2 = (CompilerGLSL *)
             std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
             operator*(&compiler->compiler);
    spirv_cross::CompilerGLSL::set_common_options(pCVar2,&options->glsl);
    this_00 = (CompilerMSL *)
              std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
              operator*(&compiler->compiler);
    spirv_cross::CompilerMSL::set_msl_options(this_00,&options->msl);
  }
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_install_compiler_options(spvc_compiler compiler, spvc_compiler_options options)
{
	(void)options;
	switch (compiler->backend)
	{
#if SPIRV_CROSS_C_API_GLSL
	case SPVC_BACKEND_GLSL:
		static_cast<CompilerGLSL &>(*compiler->compiler).set_common_options(options->glsl);
		break;
#endif

#if SPIRV_CROSS_C_API_HLSL
	case SPVC_BACKEND_HLSL:
		static_cast<CompilerHLSL &>(*compiler->compiler).set_common_options(options->glsl);
		static_cast<CompilerHLSL &>(*compiler->compiler).set_hlsl_options(options->hlsl);
		break;
#endif

#if SPIRV_CROSS_C_API_MSL
	case SPVC_BACKEND_MSL:
		static_cast<CompilerMSL &>(*compiler->compiler).set_common_options(options->glsl);
		static_cast<CompilerMSL &>(*compiler->compiler).set_msl_options(options->msl);
		break;
#endif

	default:
		break;
	}

	return SPVC_SUCCESS;
}